

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void av1_idct8_low1_ssse3(__m128i *input,__m128i *output)

{
  undefined1 auVar1 [16];
  __m128i alVar2;
  
  auVar1 = pshuflw(ZEXT416((uint)0xb50),ZEXT416((uint)0xb50),0);
  auVar1._4_4_ = auVar1._0_4_;
  auVar1._8_4_ = auVar1._0_4_;
  auVar1._12_4_ = auVar1._0_4_;
  auVar1 = psllw(auVar1,3);
  alVar2 = (__m128i)pmulhrsw(auVar1,(undefined1  [16])*input);
  *output = alVar2;
  output[7] = alVar2;
  output[1] = alVar2;
  output[6] = alVar2;
  output[2] = alVar2;
  output[5] = alVar2;
  output[3] = alVar2;
  output[4] = alVar2;
  return;
}

Assistant:

void av1_idct8_low1_ssse3(const __m128i *input, __m128i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);

  // stage 1
  __m128i x[2];
  x[0] = input[0];

  // stage 2
  // stage 3
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);

  // stage 4
  // stage 5
  output[0] = x[0];
  output[7] = x[0];
  output[1] = x[1];
  output[6] = x[1];
  output[2] = x[1];
  output[5] = x[1];
  output[3] = x[0];
  output[4] = x[0];
}